

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddNormal
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pNormalIdx,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals,
          bool pNormalPerVertex)

{
  float fVar1;
  pointer piVar2;
  pointer piVar3;
  size_t sVar4;
  _List_node_base *p_Var5;
  aiVector3D *paVar6;
  _List_node_base *p_Var7;
  float fVar8;
  float fVar9;
  size_t i;
  int *piVar10;
  aiVector3D *paVar11;
  runtime_error *prVar12;
  long *plVar13;
  _List_node_base *p_Var14;
  size_type *psVar15;
  long *plVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  size_type __n;
  ulong uVar20;
  int *piVar21;
  ulong uVar22;
  long lVar23;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tind;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> norm_arr_copy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_f8;
  vector<int,_std::allocator<int>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_d8 = pCoordIdx;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (&local_f8,
             (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl._M_node._M_size);
  p_Var14 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var14 != (_List_node_base *)pNormals) {
    do {
      if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_f8,
                   (iterator)
                   local_f8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(aiVector3t<float> *)(p_Var14 + 1));
      }
      else {
        (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_finish)->z = *(float *)&p_Var14[1]._M_prev;
        *(_List_node_base **)
         local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_finish = p_Var14[1]._M_next;
        local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var14 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var14 != (_List_node_base *)pNormals);
  }
  piVar2 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)piVar3 - (long)piVar2 >> 2;
  if (pNormalPerVertex) {
    if (piVar3 == piVar2) {
      sVar4 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl._M_node._M_size;
      uVar17 = pMesh->mNumVertices;
      if (sVar4 != uVar17) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_118 = &local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "MeshGeometry_AddNormal. Normals and vertices count must be equal.","");
        std::runtime_error::runtime_error(prVar12,(string *)&local_118);
        *(undefined ***)prVar12 = &PTR__runtime_error_00875f28;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar22 = sVar4 * 0xc;
      paVar11 = (aiVector3D *)operator_new__(uVar22);
      if (uVar17 != 0) {
        lVar23 = 0;
        memset(paVar11,0,((uVar22 - 0xc) / 0xc) * 0xc + 0xc);
        pMesh->mNormals = paVar11;
        p_Var14 = (pNormals->
                  super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                  _M_node.super__List_node_base._M_next;
        uVar22 = 0;
        do {
          p_Var5 = p_Var14[1]._M_next;
          p_Var7 = p_Var14 + 1;
          p_Var14 = p_Var14->_M_next;
          paVar11 = pMesh->mNormals;
          *(undefined4 *)((long)&paVar11->z + lVar23) = *(undefined4 *)&p_Var7->_M_prev;
          *(_List_node_base **)((long)&paVar11->x + lVar23) = p_Var5;
          uVar22 = uVar22 + 1;
          lVar23 = lVar23 + 0xc;
        } while (uVar22 < pMesh->mNumVertices);
        goto LAB_00620ad9;
      }
    }
    else {
      if ((long)piVar3 - (long)piVar2 !=
          (long)(local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_118 = &local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"Normals and Coords inidces count must be equal.","");
        std::runtime_error::runtime_error(prVar12,(string *)&local_118);
        *(undefined ***)prVar12 = &PTR__runtime_error_00875f28;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_138,__n);
      piVar21 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar10 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar21 != piVar10) {
        do {
          plVar13 = (long *)(long)*piVar21;
          if (plVar13 != (long *)0xffffffffffffffff) {
            local_118 = plVar13;
            if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&local_138,
                         (iterator)
                         local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_118);
            }
            else {
              *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)plVar13;
              local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            piVar10 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          piVar21 = piVar21 + 1;
        } while (piVar21 != piVar10);
      }
      uVar17 = pMesh->mNumVertices;
      uVar22 = (ulong)uVar17 * 0xc;
      paVar11 = (aiVector3D *)operator_new__(uVar22);
      if (uVar17 != 0) {
        lVar23 = 0;
        memset(paVar11,0,((uVar22 - 0xc) / 0xc) * 0xc + 0xc);
        pMesh->mNormals = paVar11;
        uVar22 = 0;
        do {
          if ((ulong)((long)local_138.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_138.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar22) break;
          uVar20 = local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar22];
          if ((ulong)(((long)local_f8.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f8.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
              <= uVar20) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<unsigned_long>
                      (&local_b0,
                       local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar22]);
            std::operator+(&local_70,"MeshGeometry_AddNormal. Normal index(",&local_b0);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_d0._M_dataplus._M_p = (pointer)*plVar13;
            psVar15 = (size_type *)(plVar13 + 2);
            if ((size_type *)local_d0._M_dataplus._M_p == psVar15) {
              local_d0.field_2._M_allocated_capacity = *psVar15;
              local_d0.field_2._8_8_ = plVar13[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar15;
            }
            local_d0._M_string_length = plVar13[1];
            *plVar13 = (long)psVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            to_string<unsigned_long>
                      (&local_90,
                       ((long)local_f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
            ;
            std::operator+(&local_50,&local_d0,&local_90);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_118 = (long *)*plVar13;
            plVar16 = plVar13 + 2;
            if (local_118 == plVar16) {
              local_108 = *plVar16;
              lStack_100 = plVar13[3];
              local_118 = &local_108;
            }
            else {
              local_108 = *plVar16;
            }
            local_110 = plVar13[1];
            *plVar13 = (long)plVar16;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::runtime_error::runtime_error(prVar12,(string *)&local_118);
            *(undefined ***)prVar12 = &PTR__runtime_error_00875f28;
            __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          paVar11 = pMesh->mNormals;
          *(float *)((long)&paVar11->z + lVar23) =
               local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar20].z;
          *(undefined8 *)((long)&paVar11->x + lVar23) =
               *(undefined8 *)
                (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar20);
          uVar22 = uVar22 + 1;
          lVar23 = lVar23 + 0xc;
        } while (uVar22 < pMesh->mNumVertices);
        goto LAB_00620ad9;
      }
    }
    pMesh->mNormals = paVar11;
  }
  else {
    if (piVar3 == piVar2) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&local_138,(ulong)pMesh->mNumFaces);
      local_118 = (long *)0x0;
      if (pMesh->mNumFaces != 0) {
        do {
          if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_138,
                       (iterator)
                       local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_118);
          }
          else {
            *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_118;
            local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          local_118 = (long *)((long)local_118 + 1);
        } while (local_118 < (long *)(ulong)pMesh->mNumFaces);
      }
    }
    else {
      if (__n != pMesh->mNumFaces) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_118 = &local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"Normals faces count must be equal to mesh faces count.","")
        ;
        std::runtime_error::runtime_error(prVar12,(string *)&local_118);
        *(undefined ***)prVar12 = &PTR__runtime_error_00875f28;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_138,__n);
      lVar23 = (long)(pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar23 != 0) {
        lVar23 = lVar23 >> 2;
        lVar19 = 0;
        do {
          local_118 = (long *)(long)piVar2[lVar19];
          if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_138,
                       (iterator)
                       local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_118);
          }
          else {
            *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_118;
            local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          lVar19 = lVar19 + 1;
        } while (lVar23 + (ulong)(lVar23 == 0) != lVar19);
      }
    }
    uVar17 = pMesh->mNumVertices;
    uVar22 = (ulong)uVar17 * 0xc;
    paVar11 = (aiVector3D *)operator_new__(uVar22);
    if (uVar17 != 0) {
      memset(paVar11,0,((uVar22 - 0xc) / 0xc) * 0xc + 0xc);
    }
    pMesh->mNormals = paVar11;
    uVar17 = pMesh->mNumFaces;
    if (uVar17 != 0) {
      uVar22 = 0;
      do {
        uVar20 = (ulong)pMesh->mFaces[uVar22].mNumIndices;
        if (uVar20 != 0) {
          fVar8 = local_f8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start
                  [local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar22]].x;
          fVar9 = local_f8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start
                  [local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar22]].y;
          fVar1 = local_f8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start
                  [local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar22]].z;
          uVar18 = 0;
          do {
            paVar6 = pMesh->mNormals;
            uVar17 = pMesh->mFaces[uVar22].mIndices[uVar18];
            paVar11 = paVar6 + uVar17;
            paVar11->x = fVar8;
            paVar11->y = fVar9;
            paVar6[uVar17].z = fVar1;
            uVar18 = uVar18 + 1;
          } while (uVar20 != uVar18);
          uVar17 = pMesh->mNumFaces;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < uVar17);
    }
  }
LAB_00620ad9:
  if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddNormal(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pNormalIdx,
								const std::list<aiVector3D>& pNormals, const bool pNormalPerVertex) const
{
    std::vector<size_t> tind;
    std::vector<aiVector3D> norm_arr_copy;

	// copy list to array because we are need indexed access to normals.
	norm_arr_copy.reserve(pNormals.size());
    for ( std::list<aiVector3D>::const_iterator it = pNormals.begin(); it != pNormals.end(); ++it )
    {
        norm_arr_copy.push_back( *it );
    }

	if(pNormalPerVertex)
	{
		if(pNormalIdx.size() > 0)
		{
			// check indices array count.
			if(pNormalIdx.size() != pCoordIdx.size()) throw DeadlyImportError("Normals and Coords inidces count must be equal.");

			tind.reserve(pNormalIdx.size());
			for(std::vector<int32_t>::const_iterator it = pNormalIdx.begin(); it != pNormalIdx.end(); ++it)
			{
				if(*it != (-1)) tind.push_back(*it);
			}

			// copy normals to mesh
			pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
			for(size_t i = 0; (i < pMesh.mNumVertices) && (i < tind.size()); i++)
			{
				if(tind[i] >= norm_arr_copy.size())
					throw DeadlyImportError("MeshGeometry_AddNormal. Normal index(" + to_string(tind[i]) +
											") is out of range. Normals count: " + to_string(norm_arr_copy.size()) + ".");

				pMesh.mNormals[i] = norm_arr_copy[tind[i]];
			}
		}
		else
		{
			if(pNormals.size() != pMesh.mNumVertices) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and vertices count must be equal.");

			// copy normals to mesh
			pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
			std::list<aiVector3D>::const_iterator norm_it = pNormals.begin();
			for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mNormals[i] = *norm_it++;
		}
	}// if(pNormalPerVertex)
	else
	{
		if(pNormalIdx.size() > 0)
		{
			if(pMesh.mNumFaces != pNormalIdx.size()) throw DeadlyImportError("Normals faces count must be equal to mesh faces count.");

			std::vector<int32_t>::const_iterator normidx_it = pNormalIdx.begin();

			tind.reserve(pNormalIdx.size());
			for(size_t i = 0, i_e = pNormalIdx.size(); i < i_e; i++) tind.push_back(*normidx_it++);

		}
		else
		{
			tind.reserve(pMesh.mNumFaces);
			for(size_t i = 0; i < pMesh.mNumFaces; i++) tind.push_back(i);

		}

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			aiVector3D tnorm;

			tnorm = norm_arr_copy[tind[fi]];
			for(size_t vi = 0, vi_e = pMesh.mFaces[fi].mNumIndices; vi < vi_e; vi++) pMesh.mNormals[pMesh.mFaces[fi].mIndices[vi]] = tnorm;
		}
	}// if(pNormalPerVertex) else
}